

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O2

int CreateMux(char *filename,WebPMux **mux)

{
  int iVar1;
  WebPMux *pWVar2;
  WebPData bitstream;
  
  iVar1 = ExUtilReadFileToWebPData(filename,&bitstream);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    pWVar2 = WebPMuxCreateInternal(&bitstream,1,0x108);
    *mux = pWVar2;
    WebPDataClear(&bitstream);
    if (*mux == (WebPMux *)0x0) {
      iVar1 = 0;
      fprintf(_stderr,"Failed to create mux object from file %s.\n",filename);
    }
  }
  return iVar1;
}

Assistant:

static int CreateMux(const char* const filename, WebPMux** mux) {
  WebPData bitstream;
  assert(mux != NULL);
  if (!ExUtilReadFileToWebPData(filename, &bitstream)) return 0;
  *mux = WebPMuxCreate(&bitstream, 1);
  WebPDataClear(&bitstream);
  if (*mux != NULL) return 1;
  WFPRINTF(stderr, "Failed to create mux object from file %s.\n",
           (const W_CHAR*)filename);
  return 0;
}